

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

char * __thiscall
google::protobuf::internal::WireFormat::MessageSetParser::ParseMessageSet
          (MessageSetParser *this,char *ptr,ParseContext *ctx)

{
  byte bVar1;
  uint32_t uVar2;
  DescriptorPool *this_00;
  bool bVar3;
  ExtensionRange *pEVar4;
  FieldDescriptor *field;
  uint number;
  byte *pbVar5;
  uint res;
  int iVar6;
  int iVar7;
  pair<const_char_*,_unsigned_int> pVar8;
  byte *local_48 [3];
  
  local_48[0] = (byte *)ptr;
  do {
    bVar3 = EpsCopyInputStream::DoneWithCheck<false>
                      (&ctx->super_EpsCopyInputStream,(char **)local_48,ctx->group_depth_);
    if (bVar3) {
      return (char *)local_48[0];
    }
    bVar1 = *local_48[0];
    res = (uint)bVar1;
    pbVar5 = local_48[0] + 1;
    if ((char)bVar1 < '\0') {
      res = ((uint)bVar1 + (uint)*pbVar5 * 0x80) - 0x80;
      if ((char)*pbVar5 < '\0') {
        pVar8 = ReadTagFallback((char *)local_48[0],res);
        pbVar5 = (byte *)pVar8.first;
        if (pbVar5 == (byte *)0x0) {
          return (char *)0x0;
        }
        res = pVar8.second;
      }
      else {
        pbVar5 = local_48[0] + 2;
      }
    }
    if ((res == 0) || ((res & 7) == 4)) {
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
      return (char *)pbVar5;
    }
    local_48[0] = pbVar5;
    if (res == 0xb) {
      iVar6 = ctx->depth_;
      ctx->depth_ = iVar6 + -1;
      if (iVar6 < 1) {
        return (char *)0x0;
      }
      iVar7 = ctx->group_depth_;
      ctx->group_depth_ = iVar7 + 1;
      pbVar5 = (byte *)ParseElement(this,(char *)pbVar5,ctx);
      if (pbVar5 == (byte *)0x0) {
        iVar7 = ctx->group_depth_ + -1;
        iVar6 = ctx->depth_ + 1;
      }
      else {
        if (iVar6 + -1 != ctx->depth_) {
          ParseMessageSet();
LAB_00268d94:
          ParseMessageSet();
        }
        if (iVar7 + 1 != ctx->group_depth_) goto LAB_00268d94;
      }
      ctx->group_depth_ = iVar7;
      ctx->depth_ = iVar6;
      uVar2 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
      if (uVar2 != 0xb) {
        return (char *)0x0;
      }
    }
    else {
      number = res >> 3;
      pEVar4 = Descriptor::FindExtensionRangeContainingNumber(this->descriptor,number);
      if (pEVar4 == (ExtensionRange *)0x0) {
        field = (FieldDescriptor *)0x0;
      }
      else {
        this_00 = (ctx->data_).pool;
        if (this_00 == (DescriptorPool *)0x0) {
          field = Reflection::FindKnownExtensionByNumber(this->reflection,number);
        }
        else {
          field = DescriptorPool::FindExtensionByNumber(this_00,this->descriptor,number);
        }
      }
      pbVar5 = (byte *)_InternalParseAndMergeField
                                 (this->msg,(char *)local_48[0],ctx,(ulong)res,this->reflection,
                                  field);
    }
    local_48[0] = pbVar5;
    if (pbVar5 == (byte *)0x0) {
      return (char *)0x0;
    }
  } while( true );
}

Assistant:

const char* ParseMessageSet(const char* ptr, internal::ParseContext* ctx) {
    while (!ctx->Done(&ptr)) {
      uint32_t tag;
      ptr = ReadTag(ptr, &tag);
      if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
      if (tag == 0 || (tag & 7) == WireFormatLite::WIRETYPE_END_GROUP) {
        ctx->SetLastTag(tag);
        break;
      }
      if (tag == WireFormatLite::kMessageSetItemStartTag) {
        // A message set item starts
        ptr = ctx->ParseGroupInlined(
            ptr, tag, [&](const char* ptr) { return ParseElement(ptr, ctx); });
      } else {
        // Parse other fields as normal extensions.
        int field_number = WireFormatLite::GetTagFieldNumber(tag);
        const FieldDescriptor* field = nullptr;
        if (descriptor->IsExtensionNumber(field_number)) {
          if (ctx->data().pool == nullptr) {
            field = reflection->FindKnownExtensionByNumber(field_number);
          } else {
            field = ctx->data().pool->FindExtensionByNumber(descriptor,
                                                            field_number);
          }
        }
        ptr = WireFormat::_InternalParseAndMergeField(msg, ptr, ctx, tag,
                                                      reflection, field);
      }
      if (ABSL_PREDICT_FALSE(ptr == nullptr)) return nullptr;
    }
    return ptr;
  }